

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboTestUtil::DepthGradientShader::DepthGradientShader
          (DepthGradientShader *this,DataType outputType)

{
  GenericVecType type_;
  ShaderProgramDeclaration *pSVar1;
  char *pcVar2;
  UniformSlot *pUVar3;
  allocator<char> local_3d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  FragmentSource local_338;
  allocator<char> local_311;
  string local_310;
  VertexSource local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  Uniform local_2a8;
  allocator<char> local_279;
  string local_278;
  Uniform local_258;
  allocator<char> local_229;
  string local_228;
  Uniform local_208;
  FragmentOutput local_1e0;
  VertexToFragmentVarying local_1dc;
  allocator<char> local_1d1;
  string local_1d0;
  VertexAttribute local_1b0;
  allocator<char> local_171;
  string local_170;
  VertexAttribute local_150;
  ShaderProgramDeclaration local_128;
  DataType local_14;
  DepthGradientShader *pDStack_10;
  DataType outputType_local;
  DepthGradientShader *this_local;
  
  local_14 = outputType;
  pDStack_10 = this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"a_position",&local_171);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_150,&local_170,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_128,&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"a_coord",&local_1d1);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_1b0,&local_1d0,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1b0);
  sglr::pdec::VertexToFragmentVarying::VertexToFragmentVarying(&local_1dc,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1dc);
  type_ = mapDataTypeToGenericVecType(local_14);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_1e0,type_);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"u_maxGradient",&local_229);
  sglr::pdec::Uniform::Uniform(&local_208,&local_228,TYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"u_minGradient",&local_279);
  sglr::pdec::Uniform::Uniform(&local_258,&local_278,TYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"u_color",&local_2c9);
  sglr::pdec::Uniform::Uniform(&local_2a8,&local_2c8,TYPE_FLOAT_VEC4);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_coord;\nout highp vec4 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,&local_311);
  sglr::pdec::VertexSource::VertexSource(&local_2f0,&local_310);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,
             "#version 300 es\nin highp vec4 v_coord;\nuniform highp float u_minGradient;\nuniform highp float u_maxGradient;\nuniform highp vec4 u_color;\nlayout(location = 0) out highp "
             ,&local_3d9);
  pcVar2 = glu::getDataTypeName(local_14);
  std::operator+(&local_3b8,&local_3d8,pcVar2);
  std::operator+(&local_398,&local_3b8,
                 " o_color;\nvoid main (void)\n{\n\thighp float x = v_coord.x;\n\thighp float y = v_coord.y;\n\thighp float f0 = (x + y) * 0.5;\n\tgl_FragDepth = u_minGradient + (u_maxGradient-u_minGradient)*f0;\n\to_color = "
                );
  pcVar2 = glu::getDataTypeName(local_14);
  std::operator+(&local_378,&local_398,pcVar2);
  std::operator+(&local_358,&local_378,"(u_color);\n}\n");
  sglr::pdec::FragmentSource::FragmentSource(&local_338,&local_358);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_338);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  sglr::pdec::FragmentSource::~FragmentSource(&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  sglr::pdec::VertexSource::~VertexSource(&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  sglr::pdec::Uniform::~Uniform(&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  sglr::pdec::Uniform::~Uniform(&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  sglr::pdec::Uniform::~Uniform(&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_128);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_015adae0;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_015adb18;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_015adb30;
  *(DataType *)&(this->super_ShaderProgram).field_0x154 = local_14;
  pUVar3 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_minGradient");
  this->u_minGradient = pUVar3;
  pUVar3 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_maxGradient");
  this->u_maxGradient = pUVar3;
  pUVar3 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_color");
  this->u_color = pUVar3;
  return;
}

Assistant:

DepthGradientShader::DepthGradientShader (glu::DataType outputType)
	: ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
					<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
					<< sglr::pdec::Uniform("u_maxGradient", glu::TYPE_FLOAT)
					<< sglr::pdec::Uniform("u_minGradient", glu::TYPE_FLOAT)
					<< sglr::pdec::Uniform("u_color", glu::TYPE_FLOAT_VEC4)
					<< sglr::pdec::VertexSource(
							"#version 300 es\n"
							"in highp vec4 a_position;\n"
							"in highp vec4 a_coord;\n"
							"out highp vec4 v_coord;\n"
							"void main (void)\n"
							"{\n"
							"	gl_Position = a_position;\n"
							"	v_coord = a_coord;\n"
							"}\n")
					<< sglr::pdec::FragmentSource(
							string(
								"#version 300 es\n"
								"in highp vec4 v_coord;\n"
								"uniform highp float u_minGradient;\n"
								"uniform highp float u_maxGradient;\n"
								"uniform highp vec4 u_color;\n"
								"layout(location = 0) out highp ") + glu::getDataTypeName(outputType) + " o_color;\n"
								"void main (void)\n"
								"{\n"
								"	highp float x = v_coord.x;\n"
								"	highp float y = v_coord.y;\n"
								"	highp float f0 = (x + y) * 0.5;\n"
								"	gl_FragDepth = u_minGradient + (u_maxGradient-u_minGradient)*f0;\n"
								"	o_color = " + glu::getDataTypeName(outputType) + "(u_color);\n"
								"}\n"))
	, m_outputType	(outputType)
	, u_minGradient	(getUniformByName("u_minGradient"))
	, u_maxGradient	(getUniformByName("u_maxGradient"))
	, u_color		(getUniformByName("u_color"))
{
}